

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_io.h
# Opt level: O1

void __thiscall
dmlc::MemoryFixedSizeStream::Write(MemoryFixedSizeStream *this,void *ptr,size_t size)

{
  LogMessageFatal LStack_1a8;
  
  if (size != 0) {
    if (this->buffer_size_ < this->curr_ptr_ + size) {
      LogMessageFatal::LogMessageFatal
                (&LStack_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/memory_io.h"
                 ,0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&LStack_1a8,"Check failed: curr_ptr_ + size <= buffer_size_",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,": ",2);
      LogMessageFatal::~LogMessageFatal(&LStack_1a8);
    }
    memcpy(this->p_buffer_ + this->curr_ptr_,ptr,size);
    this->curr_ptr_ = this->curr_ptr_ + size;
  }
  return;
}

Assistant:

virtual void Write(const void *ptr, size_t size) {
    if (size == 0)
      return;
    CHECK(curr_ptr_ + size <= buffer_size_);
    std::memcpy(p_buffer_ + curr_ptr_, ptr, size);
    curr_ptr_ += size;
  }